

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

uint32_t idForLocale(char *locale,char *countryAndVariant,int capacity,UErrorCode *ec)

{
  size_t sVar1;
  undefined4 in_register_00000014;
  uint32_t uVar2;
  uint uVar3;
  char variant [157];
  int local_c8;
  undefined4 uStack_c4;
  
  ulocimp_getRegionForSupplementalData_63
            (locale,'\0',countryAndVariant,0x9d,
             (UErrorCode *)CONCAT44(in_register_00000014,capacity));
  uloc_getVariant_63(locale,(char *)&local_c8,0x9d,
                     (UErrorCode *)CONCAT44(in_register_00000014,capacity));
  uVar2 = 0;
  if (((char)local_c8 != '\0') &&
     (uVar3 = (uint)(CONCAT44(uStack_c4,local_c8) == 0x4f525545455250) * 2 |
              (uint)((char)uStack_c4 == '\0' && local_c8 == 0x4f525545), uVar2 = 0, uVar3 != 0)) {
    sVar1 = strlen(countryAndVariant);
    (countryAndVariant + sVar1)[0] = '_';
    (countryAndVariant + sVar1)[1] = '\0';
    strcat(countryAndVariant,(char *)&local_c8);
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static uint32_t
idForLocale(const char* locale, char* countryAndVariant, int capacity, UErrorCode* ec)
{
    uint32_t variantType = 0;
    // !!! this is internal only, assumes buffer is not null and capacity is sufficient
    // Extract the country name and variant name.  We only
    // recognize two variant names, EURO and PREEURO.
    char variant[ULOC_FULLNAME_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, FALSE, countryAndVariant, capacity, ec);
    uloc_getVariant(locale, variant, sizeof(variant), ec);
    if (variant[0] != 0) {
        variantType = (uint32_t)(0 == uprv_strcmp(variant, VAR_EURO))
                   | ((uint32_t)(0 == uprv_strcmp(variant, VAR_PRE_EURO)) << 1);
        if (variantType)
        {
            uprv_strcat(countryAndVariant, VAR_DELIM_STR);
            uprv_strcat(countryAndVariant, variant);
        }
    }
    return variantType;
}